

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

size_t mspace_footprint(mspace msp)

{
  mstate ms;
  size_t result;
  mspace msp_local;
  
  return *(size_t *)((long)msp + 0x358);
}

Assistant:

size_t mspace_footprint(mspace msp) {
  size_t result = 0;
  mstate ms = (mstate)msp;
  if (ok_magic(ms)) {
    result = ms->footprint;
  }
  else {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return result;
}